

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

void __thiscall libtorrent::dht::dht_tracker::new_socket(dht_tracker *this,listen_socket_handle *s)

{
  dht_observer *pdVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
  _Var5;
  tuple<boost::asio::io_context_&,_const_libtorrent::aux::listen_socket_handle_&,_libtorrent::dht::dht_tracker_*&&,_const_libtorrent::aux::session_settings_&,_const_libtorrent::digest32<160L>_&,_libtorrent::dht::dht_observer_*&,_libtorrent::counters_&,_std::_Bind<libtorrent::dht::node_*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::digest32<160L>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>_&&,_libtorrent::dht::dht_storage_interface_&>
  *__args_2;
  long lVar6;
  listen_socket_handle *plVar7;
  long lVar8;
  pointer a1;
  pointer ppVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>,_bool>
  pVar10;
  span<const_char> in;
  piecewise_construct_t local_109;
  listen_socket_handle *local_108;
  pointer local_100;
  string local_f8;
  address local_address;
  _Head_base<0UL,_const_libtorrent::aux::listen_socket_handle_&,_false> local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a8 [16];
  _Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
  local_98;
  _Head_base<2UL,_libtorrent::dht::dht_tracker_*&&,_false> local_78;
  _Head_base<1UL,_const_libtorrent::aux::listen_socket_handle_&,_false> local_70;
  _Head_base<0UL,_boost::asio::io_context_&,_false> local_68;
  node_id nid;
  dht_tracker *local_38;
  
  aux::listen_socket_handle::get_local_endpoint((endpoint *)local_a8,s);
  if (local_a8._0_2_ != 2) {
    local_address.ipv6_address_.addr_.__in6_u._0_8_ = local_a8._8_8_;
    local_address.ipv6_address_.addr_.__in6_u._8_8_ =
         local_98.
         super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
         super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_address.ipv6_address_.scope_id_ =
         (ulong)local_98.
                super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
                .super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.
                m_sock.
                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi & 0xffffffff;
    local_a8._4_4_ = 0;
  }
  else {
    local_address.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_address.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_address.ipv6_address_.scope_id_ = 0;
  }
  local_address.type_ = (anon_enum_32)(local_a8._0_2_ != 2);
  a1 = (this->m_state).nids.
       super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_100 = (this->m_state).nids.
              super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)local_100 - (long)a1;
  local_108 = s;
  local_address.ipv4_address_.addr_.s_addr = (in4_addr_type)(in4_addr_type)local_a8._4_4_;
  for (lVar6 = lVar8 / 0x38 >> 2; plVar7 = local_108, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar3 = boost::asio::ip::operator==(&a1->first,&local_address);
    plVar7 = local_108;
    ppVar9 = a1;
    if (bVar3) goto LAB_00353ff3;
    bVar3 = boost::asio::ip::operator==(&a1[1].first,&local_address);
    plVar7 = local_108;
    ppVar9 = a1 + 1;
    if (bVar3) goto LAB_00353ff3;
    bVar3 = boost::asio::ip::operator==(&a1[2].first,&local_address);
    plVar7 = local_108;
    ppVar9 = a1 + 2;
    if (bVar3) goto LAB_00353ff3;
    bVar3 = boost::asio::ip::operator==(&a1[3].first,&local_address);
    plVar7 = local_108;
    ppVar9 = a1 + 3;
    if (bVar3) goto LAB_00353ff3;
    a1 = a1 + 4;
    lVar8 = lVar8 + -0xe0;
  }
  lVar8 = lVar8 / 0x38;
  if (lVar8 != 1) {
    if (lVar8 != 2) {
      ppVar9 = local_100;
      if ((lVar8 != 3) ||
         (bVar3 = boost::asio::ip::operator==(&a1->first,&local_address), ppVar9 = a1, bVar3))
      goto LAB_00353ff3;
      a1 = a1 + 1;
    }
    bVar3 = boost::asio::ip::operator==(&a1->first,&local_address);
    ppVar9 = a1;
    if (bVar3) goto LAB_00353ff3;
    a1 = a1 + 1;
  }
  bVar3 = boost::asio::ip::operator==(&a1->first,&local_address);
  ppVar9 = local_100;
  if (bVar3) {
    ppVar9 = a1;
  }
LAB_00353ff3:
  if (ppVar9 == (this->m_state).nids.
                super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    digest32<160L>::clear(&nid);
  }
  else {
    nid.m_number._M_elems[4] = (ppVar9->second).m_number._M_elems[4];
    nid.m_number._M_elems._0_8_ = *(undefined8 *)(ppVar9->second).m_number._M_elems;
    nid.m_number._M_elems._8_8_ = *(undefined8 *)((ppVar9->second).m_number._M_elems + 2);
  }
  local_68._M_head_impl = this->m_ioc;
  local_78._M_head_impl = &local_38;
  local_98.super__Head_base<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->m_settings;
  local_98.super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this->m_counters;
  local_a8._8_8_ = &local_f8;
  local_f8._M_dataplus._M_p = (pointer)get_node;
  local_f8._M_string_length = 0;
  local_a8._0_8_ = this->m_storage;
  __args_2 = (tuple<boost::asio::io_context_&,_const_libtorrent::aux::listen_socket_handle_&,_libtorrent::dht::dht_tracker_*&&,_const_libtorrent::aux::session_settings_&,_const_libtorrent::digest32<160L>_&,_libtorrent::dht::dht_observer_*&,_libtorrent::counters_&,_std::_Bind<libtorrent::dht::node_*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::digest32<160L>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>_&&,_libtorrent::dht::dht_storage_interface_&>
              *)local_a8;
  local_98.super__Head_base<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&nid;
  local_f8.field_2._M_allocated_capacity = (size_type)this;
  local_b8._M_head_impl = plVar7;
  local_98.super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
  super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->m_log;
  local_70._M_head_impl = plVar7;
  local_38 = this;
  pVar10 = ::std::
           _Rb_tree<libtorrent::aux::listen_socket_handle,std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>,std::_Select1st<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>,std::less<libtorrent::aux::listen_socket_handle>,std::allocator<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>>
           ::
           _M_emplace_unique<std::piecewise_construct_t,std::tuple<libtorrent::aux::listen_socket_handle_const&>,std::tuple<boost::asio::io_context&,libtorrent::aux::listen_socket_handle_const&,libtorrent::dht::dht_tracker*&&,libtorrent::aux::session_settings_const&,libtorrent::digest32<160l>const&,libtorrent::dht::dht_observer*&,libtorrent::counters&,std::_Bind<libtorrent::dht::node*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker*,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::digest32<160l>const&,std::basic_string_view<char,std::char_traits<char>>)>&&,libtorrent::dht::dht_storage_interface&>>
                     ((_Rb_tree<libtorrent::aux::listen_socket_handle,std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>,std::_Select1st<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>,std::less<libtorrent::aux::listen_socket_handle>,std::allocator<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>>
                       *)&this->m_nodes,&local_109,
                      (tuple<const_libtorrent::aux::listen_socket_handle_&> *)&local_b8,__args_2);
  _Var5 = pVar10.first._M_node;
  update_storage_node_ids(this);
  iVar4 = (**(this->m_log->super_dht_logger)._vptr_dht_logger)(this->m_log,0);
  if ((char)iVar4 != '\0') {
    pdVar1 = this->m_log;
    boost::asio::ip::address::to_string_abi_cxx11_((string *)local_a8,&local_address);
    uVar2 = local_a8._0_8_;
    in.m_len = (difference_type)__args_2;
    in.m_ptr = (char *)0x14;
    aux::to_hex_abi_cxx11_(&local_f8,(aux *)&_Var5._M_node[4]._M_left,in);
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
              (pdVar1,0,"starting %s DHT tracker with node id: %s",uVar2,local_f8._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_f8);
    ::std::__cxx11::string::~string((string *)local_a8);
  }
  if ((this->m_running == true) &&
     (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    local_a8._0_8_ = 1000000000;
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_after((basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&_Var5._M_node[0x16]._M_left,(duration *)local_a8);
    local_f8._M_dataplus._M_p = (pointer)connection_timeout;
    local_f8._M_string_length = 0;
    ::std::__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::dht::dht_tracker,void>
              ((__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
               (__weak_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::dht::dht_tracker>);
    ::std::
    _Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>
    ::
    _Bind<std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle_const&,std::_Placeholder<1>const&>
              ((_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>
                *)local_a8,(offset_in_dht_tracker_to_subr *)&local_f8,
               (shared_ptr<libtorrent::dht::dht_tracker> *)&local_b8,
               (listen_socket_handle *)(_Var5._M_node + 1),
               (_Placeholder<1> *)&::std::placeholders::_1);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>>
              ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&_Var5._M_node[0x16]._M_left,
               (_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::system::error_code_&)>
                *)local_a8);
    ::std::
    _Tuple_impl<0UL,_std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>
    ::~_Tuple_impl(&local_98);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_98.super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
    super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98.super__Tuple_impl<1UL,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::aux::listen_socket_handle,_false>._M_head_impl.m_sock.
    super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8._0_8_ = 0;
    local_a8[8] = '\0';
    local_a8[9] = '\0';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    dht::node::bootstrap
              ((node *)&_Var5._M_node[1]._M_left,
               (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                *)&local_f8,(nodes_callback *)local_a8);
    ::std::_Function_base::~_Function_base((_Function_base *)local_a8);
    ::std::
    _Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::~_Vector_base((_Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                     *)&local_f8);
  }
  return;
}

Assistant:

void dht_tracker::new_socket(aux::listen_socket_handle const& s)
	{
		address const local_address = s.get_local_endpoint().address();
		auto stored_nid = std::find_if(m_state.nids.begin(), m_state.nids.end()
			, [&](node_ids_t::value_type const& nid) { return nid.first == local_address; });
		node_id const nid = stored_nid != m_state.nids.end() ? stored_nid->second : node_id();
		// must use piecewise construction because tracker_node::connection_timer
		// is neither copyable nor movable
		auto n = m_nodes.emplace(std::piecewise_construct_t(), std::forward_as_tuple(s)
			, std::forward_as_tuple(m_ioc
			, s, this, m_settings, nid, m_log, m_counters
			, std::bind(&dht_tracker::get_node, this, _1, _2)
			, m_storage));

		update_storage_node_ids();

#ifndef TORRENT_DISABLE_LOGGING
		if (m_log->should_log(dht_logger::tracker))
		{
			m_log->log(dht_logger::tracker, "starting %s DHT tracker with node id: %s"
				, local_address.to_string().c_str()
				, aux::to_hex(n.first->second.dht.nid()).c_str());
		}
#endif

		if (m_running && n.second)
		{
			ADD_OUTSTANDING_ASYNC("dht_tracker::connection_timeout");
			n.first->second.connection_timer.expires_after(seconds(1));
			n.first->second.connection_timer.async_wait(
				std::bind(&dht_tracker::connection_timeout, self(), n.first->first, _1));
			n.first->second.dht.bootstrap({}, find_data::nodes_callback());
		}
	}